

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_vararg.c
# Opt level: O3

int iteratorVarargReset(mpt_iterator *it)

{
  _mpt_vptr_iterator *__s;
  size_t sVar1;
  iteratorVararg *va;
  
  __s = it[5]._vptr;
  if (__s != (_mpt_vptr_iterator *)0x0) {
    if (*(char *)&__s->value != '\0') {
      it[4]._vptr = it[8]._vptr;
      it[2]._vptr = it[6]._vptr;
      it[3]._vptr = it[7]._vptr;
    }
    it[1]._vptr = __s;
    sVar1 = strlen((char *)__s);
    return (int)sVar1;
  }
  it[1]._vptr = (_mpt_vptr_iterator *)0x0;
  return 0;
}

Assistant:

static int iteratorVarargReset(MPT_INTERFACE(iterator) *it)
{
	struct iteratorVararg *va = (void *) it;
	const char *fmt = va->org.fmt;
	if (fmt && *fmt) {
		va_end(va->arg);
		va_copy(va->arg, va->org.arg);
	}
	va->fmt = fmt;
	return fmt ? strlen(fmt) : 0;
}